

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O0

void __thiscall Fl_Menu_::setonly(Fl_Menu_ *this,Fl_Menu_Item *item)

{
  int iVar1;
  Fl_Menu_Item *pFVar2;
  Fl_Menu_Item *local_28;
  Fl_Menu_Item *j;
  Fl_Menu_Item *first;
  Fl_Menu_Item *item_local;
  Fl_Menu_ *this_local;
  
  pFVar2 = first_submenu_item(item,this->menu_);
  if (pFVar2 != (Fl_Menu_Item *)0x0) {
    item->flags = item->flags | 0xc;
    local_28 = item;
    while ((((local_28->flags & 0x80U) == 0 &&
            (local_28 = local_28 + 1, local_28->text != (char *)0x0)) &&
           (iVar1 = Fl_Menu_Item::radio(local_28), iVar1 != 0))) {
      Fl_Menu_Item::clear(local_28);
    }
    local_28 = item + -1;
    while (((pFVar2 <= local_28 && (local_28->text != (char *)0x0)) &&
           (((local_28->flags & 0x80U) == 0 && (iVar1 = Fl_Menu_Item::radio(local_28), iVar1 != 0)))
           )) {
      Fl_Menu_Item::clear(local_28);
      local_28 = local_28 + -1;
    }
  }
  return;
}

Assistant:

void Fl_Menu_::setonly(Fl_Menu_Item* item) {
  // find the first item of the (sub)menu containing item
  Fl_Menu_Item* first = first_submenu_item(item, menu_);
  if (!first) return; // item does not belong to our menu
  item->flags |= FL_MENU_RADIO | FL_MENU_VALUE;
  Fl_Menu_Item* j;
  for (j = item; ; ) {	// go down
    if (j->flags & FL_MENU_DIVIDER) break; // stop on divider lines
    j++;
    if (!j->text || !j->radio()) break; // stop after group
    j->clear();
  }
  for (j = item-1; j>=first; j--) { // go up
    //DEBUG printf("GO UP: WORKING ON: item='%s', flags=%x\n", j->text, j->flags);
    if (!j->text || (j->flags&FL_MENU_DIVIDER) || !j->radio()) break;
    j->clear();
  }
}